

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O1

void __thiscall cmFindCommon::SelectDefaultMacMode(cmFindCommon *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  bool bVar7;
  bool bVar8;
  string fab;
  string ff;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  pcVar2 = (this->super_cmCommand).Makefile;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CMAKE_FIND_FRAMEWORK","");
  psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_88);
  pcVar3 = (psVar6->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar3,pcVar3 + psVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)local_68);
  if (iVar5 == 0) {
    bVar4 = false;
LAB_003768b4:
    bVar7 = false;
LAB_003768c4:
    bVar8 = false;
LAB_003768c6:
    this->SearchFrameworkLast = bVar4;
    this->SearchFrameworkFirst = bVar7;
    this->SearchFrameworkOnly = bVar8;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)local_68);
    if (iVar5 == 0) {
      bVar8 = true;
      bVar4 = false;
      bVar7 = false;
      goto LAB_003768c6;
    }
    iVar5 = std::__cxx11::string::compare((char *)local_68);
    if (iVar5 == 0) {
      bVar7 = true;
      bVar4 = false;
      goto LAB_003768c4;
    }
    iVar5 = std::__cxx11::string::compare((char *)local_68);
    if (iVar5 == 0) {
      bVar4 = true;
      goto LAB_003768b4;
    }
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_FIND_APPBUNDLE","");
  psVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_48);
  pcVar3 = (psVar6->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + psVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar5 == 0) {
    bVar4 = false;
LAB_00376988:
    bVar7 = false;
LAB_00376998:
    bVar8 = false;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar5 != 0) {
        iVar5 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar5 != 0) goto LAB_003769ac;
        bVar4 = true;
        goto LAB_00376988;
      }
      bVar7 = true;
      bVar4 = false;
      goto LAB_00376998;
    }
    bVar8 = true;
    bVar4 = false;
    bVar7 = false;
  }
  this->SearchAppBundleLast = bVar4;
  this->SearchAppBundleFirst = bVar7;
  this->SearchAppBundleOnly = bVar8;
LAB_003769ac:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

void cmFindCommon::SelectDefaultMacMode()
{
  std::string ff = this->Makefile->GetSafeDefinition("CMAKE_FIND_FRAMEWORK");
  if (ff == "NEVER") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
  } else if (ff == "ONLY") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = true;
  } else if (ff == "FIRST") {
    this->SearchFrameworkLast = false;
    this->SearchFrameworkFirst = true;
    this->SearchFrameworkOnly = false;
  } else if (ff == "LAST") {
    this->SearchFrameworkLast = true;
    this->SearchFrameworkFirst = false;
    this->SearchFrameworkOnly = false;
  }

  std::string fab = this->Makefile->GetSafeDefinition("CMAKE_FIND_APPBUNDLE");
  if (fab == "NEVER") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
  } else if (fab == "ONLY") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = true;
  } else if (fab == "FIRST") {
    this->SearchAppBundleLast = false;
    this->SearchAppBundleFirst = true;
    this->SearchAppBundleOnly = false;
  } else if (fab == "LAST") {
    this->SearchAppBundleLast = true;
    this->SearchAppBundleFirst = false;
    this->SearchAppBundleOnly = false;
  }
}